

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP5Serializer::OnetimeMarshalAttribute
          (BP5Serializer *this,char *Name,DataType Type,size_t ElemCount,void *Data)

{
  char cVar1;
  BP5Serializer *pBVar2;
  BP5AttrStruct *this_00;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  StringArrayAttr *pSVar6;
  char **ppcVar7;
  PrimitiveTypeAttr *pPVar8;
  DataType type;
  string *Str;
  size_t i;
  size_t sVar9;
  allocator local_c3;
  allocator local_c2;
  allocator local_c1;
  BP5Serializer *local_c0;
  char *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = this->PendingAttrs;
  if (this_00 == (BP5AttrStruct *)0x0) {
    this_00 = (BP5AttrStruct *)operator_new(0x20);
    BP5Base::BP5AttrStruct::BP5AttrStruct(this_00);
    this->PendingAttrs = this_00;
  }
  local_c0 = this;
  sVar3 = strlen(Name);
  pcVar4 = (char *)malloc(sVar3 + 2);
  cVar1 = 'B';
  if (ElemCount == 0xffffffffffffffff) {
    cVar1 = '0';
  }
  *pcVar4 = cVar1 + (char)Type;
  strcpy(pcVar4 + 1,Name);
  pBVar2 = local_c0;
  if (Type == String) {
    sVar5 = this_00->StrAttrCount + 1;
    this_00->StrAttrCount = sVar5;
    pSVar6 = (StringArrayAttr *)realloc(this_00->StrAttrs,sVar5 * 0x18);
    sVar5 = local_c0->PendingAttrs->StrAttrCount;
    local_c0->PendingAttrs->StrAttrs = pSVar6;
    pSVar6[sVar5 - 1].ElementCount = 0;
    (&pSVar6[sVar5 - 1].ElementCount)[1] = 0;
    pSVar6[sVar5 - 1].Name = pcVar4;
    if (ElemCount == 0xffffffffffffffff) {
      pSVar6[sVar5 - 1].ElementCount = 1;
      ppcVar7 = (char **)malloc(8);
      pSVar6[sVar5 - 1].Values = ppcVar7;
      pcVar4 = strdup(*Data);
      *ppcVar7 = pcVar4;
    }
    else {
      pSVar6[sVar5 - 1].ElementCount = ElemCount;
      ppcVar7 = (char **)malloc(ElemCount * 8);
      pSVar6[sVar5 - 1].Values = ppcVar7;
      for (sVar9 = 0; ElemCount != sVar9; sVar9 = sVar9 + 1) {
        pcVar4 = strdup(*Data);
        pSVar6[sVar5 - 1].Values[sVar9] = pcVar4;
        Data = (void *)((long)Data + 0x20);
      }
    }
  }
  else {
    local_b8 = pcVar4;
    if ((Type & ~Struct) == None) {
      std::__cxx11::string::string((string *)&local_50,"Toolkit",&local_c1);
      std::__cxx11::string::string((string *)&local_70,"format::BP5Serializer",&local_c2);
      std::__cxx11::string::string
                ((string *)&local_90,"doesn\'t support this type of Attribute",&local_c3);
      ToString_abi_cxx11_(&local_b0,(adios2 *)(ulong)Type,type);
      helper::Throw<std::logic_error>(&local_50,&local_70,&local_90,&local_b0,-1);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = pBVar2->PendingAttrs;
    }
    sVar5 = this_00->PrimAttrCount + 1;
    this_00->PrimAttrCount = sVar5;
    pPVar8 = (PrimitiveTypeAttr *)realloc(this_00->PrimAttrs,sVar5 * 0x18);
    sVar5 = pBVar2->PendingAttrs->PrimAttrCount;
    pBVar2->PendingAttrs->PrimAttrs = pPVar8;
    sVar9 = 1;
    if (ElemCount != 0xffffffffffffffff) {
      sVar9 = ElemCount;
    }
    pPVar8[sVar5 - 1].TotalElementSize = 0;
    (&pPVar8[sVar5 - 1].TotalElementSize)[1] = 0;
    pPVar8[sVar5 - 1].Name = local_b8;
    sVar3 = sVar9 * *(long *)((long)&pBVar2->_vptr_BP5Serializer +
                             (long)(pBVar2->_vptr_BP5Serializer[-3] + (long)(int)Type * 8));
    pPVar8[sVar5 - 1].TotalElementSize = sVar3;
    pcVar4 = (char *)malloc(sVar3);
    pPVar8[sVar5 - 1].Values = pcVar4;
    memcpy(pcVar4,Data,sVar3);
  }
  return;
}

Assistant:

void BP5Serializer::OnetimeMarshalAttribute(const char *Name, const DataType Type, size_t ElemCount,
                                            const void *Data)
{
    if (!PendingAttrs)
        PendingAttrs = new (BP5AttrStruct);
    char *TmpName = (char *)malloc(strlen(Name) + 2);
    TmpName[0] = '0' + (int)Type;
    if (ElemCount != (size_t)-1)
        TmpName[0] += 18; // indicates an array
    strcpy(&TmpName[1], Name);
    if (Type == DataType::String)
    {
        PendingAttrs->StrAttrCount++;
        PendingAttrs->StrAttrs = (struct StringArrayAttr *)realloc(
            PendingAttrs->StrAttrs, sizeof(StringArrayAttr) * PendingAttrs->StrAttrCount);
        StringArrayAttr *ThisAttr = &PendingAttrs->StrAttrs[PendingAttrs->StrAttrCount - 1];
        memset((void *)ThisAttr, 0, sizeof(*ThisAttr));
        ThisAttr->Name = TmpName;
        if (ElemCount == (size_t)-1)
        {
            std::string *Str = (std::string *)Data;
            ThisAttr->ElementCount = 1;
            ThisAttr->Values = (const char **)malloc(sizeof(char *));
            ThisAttr->Values[0] = strdup(Str->c_str());
        }
        else
        {
            std::string *StrArray = (std::string *)Data;
            ThisAttr->ElementCount = ElemCount;
            ThisAttr->Values = (const char **)malloc(sizeof(char *) * ElemCount);
            for (size_t i = 0; i < ElemCount; i++)
            {
                ThisAttr->Values[i] = strdup(StrArray[i].c_str());
            }
        }
    }
    else
    {
        if ((Type == DataType::None) || (Type == DataType::Struct))
        {
            helper::Throw<std::logic_error>("Toolkit", "format::BP5Serializer",
                                            "doesn't support this type of Attribute",
                                            ToString(Type));
        }
        char *Array = (char *)Data;
        PendingAttrs->PrimAttrCount++;
        PendingAttrs->PrimAttrs = (struct PrimitiveTypeAttr *)realloc(
            PendingAttrs->PrimAttrs, sizeof(PrimitiveTypeAttr) * PendingAttrs->PrimAttrCount);
        PrimitiveTypeAttr *ThisAttr = &PendingAttrs->PrimAttrs[PendingAttrs->PrimAttrCount - 1];
        if (ElemCount == (size_t)-1)
        {
            ElemCount = 1;
        }
        memset((void *)ThisAttr, 0, sizeof(*ThisAttr));
        ThisAttr->Name = TmpName;
        ThisAttr->TotalElementSize = ElemCount * DataTypeSize[(int)Type];
        ThisAttr->Values = (char *)malloc(ThisAttr->TotalElementSize);
        std::memcpy((void *)ThisAttr->Values, (void *)Array, ThisAttr->TotalElementSize);
    }
}